

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigTable.c
# Opt level: O3

Fraig_HashTable_t * Fraig_HashTableCreate(int nSize)

{
  uint uVar1;
  Fraig_HashTable_t *pFVar2;
  Fraig_Node_t **ppFVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  pFVar2 = (Fraig_HashTable_t *)calloc(1,0x10);
  uVar5 = nSize - 1;
  while( true ) {
    do {
      uVar6 = uVar5 + 1;
      uVar1 = uVar5 & 1;
      uVar5 = uVar6;
    } while (uVar1 != 0);
    if (uVar6 < 9) break;
    iVar4 = 5;
    while (uVar6 % (iVar4 - 2U) != 0) {
      uVar1 = iVar4 * iVar4;
      iVar4 = iVar4 + 2;
      if (uVar6 < uVar1) goto LAB_005f31e5;
    }
  }
LAB_005f31e5:
  pFVar2->nBins = uVar6;
  ppFVar3 = (Fraig_Node_t **)calloc(1,(long)(int)uVar6 << 3);
  pFVar2->pBins = ppFVar3;
  return pFVar2;
}

Assistant:

Fraig_HashTable_t * Fraig_HashTableCreate( int nSize )
{
    Fraig_HashTable_t * p;
    // allocate the table
    p = ABC_ALLOC( Fraig_HashTable_t, 1 );
    memset( p, 0, sizeof(Fraig_HashTable_t) );
    // allocate and clean the bins
    p->nBins = Abc_PrimeCudd(nSize);
    p->pBins = ABC_ALLOC( Fraig_Node_t *, p->nBins );
    memset( p->pBins, 0, sizeof(Fraig_Node_t *) * p->nBins );
    return p;
}